

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * flatbuffers::anon_unknown_1::DasherToSnake(string *__return_storage_ptr__,string *input)

{
  ulong uVar1;
  char *pcVar2;
  ulong local_28;
  size_t i;
  string *input_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  for (local_28 = 0; uVar1 = std::__cxx11::string::length(), local_28 < uVar1;
      local_28 = local_28 + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
    if (*pcVar2 == '-') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_");
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)input);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DasherToSnake(const std::string &input) {
  std::string s;
  for (size_t i = 0; i < input.length(); i++) {
    if (input[i] == '-') {
      s += "_";
    } else {
      s += input[i];
    }
  }
  return s;
}